

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall Wasm::WasmBytecodeGenerator::GenerateFunction(WasmBytecodeGenerator *this)

{
  FunctionBody *pFVar1;
  InterruptPoller *pIVar2;
  bool bVar3;
  uint uVar4;
  LocalFunctionId LVar5;
  uint uVar6;
  uint label;
  uint32 uVar7;
  int iVar8;
  BlockInfo *pBVar9;
  AsmJsFunctionInfo *funcInfo;
  WasmCompilationException *pWVar10;
  WasmBinaryReader *pWVar11;
  PolymorphicEmitInfo PVar12;
  undefined1 local_58 [8];
  PolymorphicEmitInfo yieldInfo;
  AutoProfilingPhase functionProfiler;
  AutoDisableInterrupt autoDisableInterrupt;
  AutoCleanupGeneratorState autoCleanupGeneratorState;
  
  pFVar1 = (this->m_funcInfo->m_body).ptr;
  if (pFVar1 == (FunctionBody *)0x0) {
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmBytecodePhase);
  }
  else {
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar1);
    LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmBytecodePhase,uVar4,LVar5);
  }
  if (bVar3 != false) {
    Output::Print(L"Generate WebAssembly Bytecode: ");
    Js::FunctionBody::DumpFullFunctionName((this->m_funcInfo->m_body).ptr);
    Output::Print(L"\n");
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
  LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,WasmBytecodePhase,uVar4,LVar5);
  if (bVar3) {
    pWVar10 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(pWVar10,L"Compilation skipped");
    __cxa_throw(pWVar10,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  yieldInfo.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)this->m_scriptContext;
  functionProfiler.scriptcontext._0_2_ = 0x23;
  functionProfiler.scriptcontext._2_1_ = 0;
  Js::ScriptContext::ProfileBegin((ScriptContext *)yieldInfo.field_1.infos,WasmBytecodePhase);
  this->m_maxArgOutDepth = 0;
  (*this->m_writer->_vptr_IWasmByteCodeWriter[1])
            (this->m_writer,(this->m_funcInfo->m_body).ptr,&this->m_alloc);
  autoDisableInterrupt._8_8_ = this;
  uVar6 = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  this->m_funcInfo->m_ExitLabel = uVar6;
  EnregisterLocals(this);
  label = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  uVar7 = WasmSignature::GetSignatureId((this->m_funcInfo->m_signature).ptr);
  pBVar9 = PushLabel(this,(WasmBlock)((ulong)uVar7 << 0x20),label,true,false);
  this->m_funcBlock = pBVar9;
  EnterEvalStackScope(this,pBVar9);
  EmitBlockCommon(this,this->m_funcBlock,(bool *)0x0);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)label);
  PVar12 = PopLabel(this,label);
  yieldInfo._0_8_ = PVar12.field_1;
  local_58._0_4_ = PVar12.count;
  if (local_58._0_4_ == 0) {
    uVar7 = WasmFunctionInfo::GetResultCount(this->m_funcInfo);
    if (uVar7 == 0) goto LAB_00d6c5c1;
  }
  else {
LAB_00d6c5c1:
    EmitReturnExpr(this,(PolymorphicEmitInfo *)local_58);
  }
  pFVar1 = (this->m_funcInfo->m_body).ptr;
  if (pFVar1 == (FunctionBody *)0x0) {
    pBVar9 = (BlockInfo *)0x23;
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmBytecodePhase);
  }
  else {
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar1);
    LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
    pBVar9 = (BlockInfo *)0x23;
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmBytecodePhase,uVar4,LVar5);
  }
  if (bVar3 != false) {
    PrintOpEnd(this);
  }
  ExitEvalStackScope(this,pBVar9);
  SetUnreachableState(this,false);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)uVar6);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[7])(this->m_writer,8);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x21])(this->m_writer,(ulong)this->currentProfileId);
  pWVar11 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar11 == (WasmBinaryReader *)0x0) {
    pWVar11 = (this->m_module->m_reader).ptr;
  }
  iVar8 = (*(pWVar11->super_WasmReaderBase)._vptr_WasmReaderBase[1])();
  if ((char)iVar8 == '\0') {
    pWVar10 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(pWVar10,L"Invalid function format");
    __cxa_throw(pWVar10,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[2])();
  pWVar11 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar11 == (WasmBinaryReader *)0x0) {
    pWVar11 = (this->m_module->m_reader).ptr;
  }
  (*(pWVar11->super_WasmReaderBase)._vptr_WasmReaderBase[3])();
  autoDisableInterrupt.m_operationCompleted = false;
  autoDisableInterrupt.m_interruptDisableState = false;
  autoDisableInterrupt.m_explicitCompletion = false;
  autoDisableInterrupt._11_5_ = 0;
  functionProfiler._8_8_ = this->m_scriptContext->threadContext;
  autoDisableInterrupt.m_threadContext._0_2_ = 0;
  autoDisableInterrupt.m_threadContext._2_1_ = 1;
  pIVar2 = ((ThreadContext *)functionProfiler._8_8_)->interruptPoller;
  if (pIVar2 != (InterruptPoller *)0x0) {
    autoDisableInterrupt.m_threadContext._0_2_ = (ushort)pIVar2->isDisabled << 8;
    pIVar2->isDisabled = true;
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
  LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01433318,WasmBytecodePhase,uVar4,LVar5);
  if (!bVar3) {
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
    LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01433318,ByteCodePhase,uVar4,LVar5);
    if (!bVar3) goto LAB_00d6c7c7;
  }
  if (this->m_originalWriter != this->m_emptyWriter) {
    Js::AsmJsByteCodeDumper::Dump
              ((this->m_funcInfo->m_body).ptr,&this->mTypedRegisterAllocator,(AsmJsFunc *)0x0);
  }
LAB_00d6c7c7:
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
  LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01433318,WasmOpCodeDistributionPhase,uVar4,LVar5);
  if (bVar3) {
    WasmBinaryReader::PrintOps((this->m_module->m_reader).ptr);
  }
  funcInfo = Js::FunctionProxy::
             GetAuxPtr<(Js::FunctionProxy::AuxPointerType)2,Js::AsmJsFunctionInfo*>
                       ((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
  WAsmJs::TypedRegisterAllocator::CommitToFunctionBody
            (&this->mTypedRegisterAllocator,(this->m_funcInfo->m_body).ptr);
  WAsmJs::TypedRegisterAllocator::CommitToFunctionInfo
            (&this->mTypedRegisterAllocator,funcInfo,(this->m_funcInfo->m_body).ptr);
  Js::FunctionBody::CheckAndSetOutParamMaxDepth
            ((this->m_funcInfo->m_body).ptr,this->m_maxArgOutDepth);
  autoDisableInterrupt.m_threadContext._0_1_ = 1;
  AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)&functionProfiler.phase);
  GenerateFunction::AutoCleanupGeneratorState::~AutoCleanupGeneratorState
            ((AutoCleanupGeneratorState *)&autoDisableInterrupt.m_operationCompleted);
  Js::AutoProfilingPhase::~AutoProfilingPhase((AutoProfilingPhase *)&yieldInfo.field_1.singleInfo);
  return;
}

Assistant:

void WasmBytecodeGenerator::GenerateFunction()
{
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (DO_WASM_TRACE_BYTECODE)
    {
        Output::Print(_u("Generate WebAssembly Bytecode: "));
        GetFunctionBody()->DumpFullFunctionName();
        Output::Print(_u("\n"));
    }
#endif
    if (PHASE_OFF(Js::WasmBytecodePhase, GetFunctionBody()))
    {
        throw WasmCompilationException(_u("Compilation skipped"));
    }
    Js::AutoProfilingPhase functionProfiler(m_scriptContext, Js::WasmBytecodePhase);
    Unused(functionProfiler);

    m_maxArgOutDepth = 0;

    m_writer->Begin(GetFunctionBody(), &m_alloc);
    struct AutoCleanupGeneratorState
    {
        WasmBytecodeGenerator* gen;
        AutoCleanupGeneratorState(WasmBytecodeGenerator* gen) : gen(gen) {}
        ~AutoCleanupGeneratorState()
        {
            if (gen)
            {
                TRACE_WASM(PHASE_TRACE(Js::WasmBytecodePhase, gen->GetFunctionBody()), _u("\nHad Compilation error!"));
                gen->GetReader()->FunctionEnd();
                gen->m_originalWriter->Reset();
            }
        }
        void Complete()
        {
            gen->m_writer->End();
            gen->GetReader()->FunctionEnd();
            gen = nullptr;
        }
    };
    AutoCleanupGeneratorState autoCleanupGeneratorState(this);
    Js::ByteCodeLabel exitLabel = m_writer->DefineLabel();
    m_funcInfo->SetExitLabel(exitLabel);
    EnregisterLocals();

    // The function's yield type is the return type
    Js::ByteCodeLabel blockLabel = m_writer->DefineLabel();
    WasmBlock funcBlockData;
    funcBlockData.SetSignatureId(m_funcInfo->GetSignature()->GetSignatureId());
    m_funcBlock = PushLabel(funcBlockData, blockLabel, true, false);
    EnterEvalStackScope(m_funcBlock);
    EmitBlockCommon(m_funcBlock);
    m_writer->MarkAsmJsLabel(blockLabel);
    PolymorphicEmitInfo yieldInfo = PopLabel(blockLabel);
    if (yieldInfo.Count() > 0 || m_funcInfo->GetResultCount() == 0)
    {
        EmitReturnExpr(&yieldInfo);
    }
    DebugPrintOpEnd();
    ExitEvalStackScope(m_funcBlock);
    SetUnreachableState(false);
    m_writer->MarkAsmJsLabel(exitLabel);
    m_writer->EmptyAsm(Js::OpCodeAsmJs::Ret);
    m_writer->SetCallSiteCount(this->currentProfileId);

    if (!GetReader()->IsCurrentFunctionCompleted())
    {
        throw WasmCompilationException(_u("Invalid function format"));
    }

    autoCleanupGeneratorState.Complete();
    // Make sure we don't have any unforeseen exceptions as we finalize the body
    AutoDisableInterrupt autoDisableInterrupt(m_scriptContext->GetThreadContext(), true);

#if DBG_DUMP
    if ((
        PHASE_DUMP(Js::WasmBytecodePhase, GetFunctionBody()) ||
        PHASE_DUMP(Js::ByteCodePhase, GetFunctionBody()) 
        ) && !IsValidating())
    {
        Js::AsmJsByteCodeDumper::Dump(GetFunctionBody(), &mTypedRegisterAllocator, nullptr);
    }
    if (PHASE_DUMP(Js::WasmOpCodeDistributionPhase, GetFunctionBody()))
    {
        m_module->GetReader()->PrintOps();
    }
#endif

    Js::AsmJsFunctionInfo* info = GetFunctionBody()->GetAsmJsFunctionInfo();
    mTypedRegisterAllocator.CommitToFunctionBody(GetFunctionBody());
    mTypedRegisterAllocator.CommitToFunctionInfo(info, GetFunctionBody());

    GetFunctionBody()->CheckAndSetOutParamMaxDepth(m_maxArgOutDepth);
    autoDisableInterrupt.Completed();
}